

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImVec2 IVar4;
  
  pIVar3 = GImGui;
  FocusWindow(window);
  SetActiveID(window->MoveId,window);
  pIVar3->NavDisableHighlight = true;
  pIVar3->ActiveIdNoClearOnFocusLoss = true;
  IVar1 = (pIVar3->IO).MousePos;
  IVar2 = window->RootWindow->Pos;
  IVar4.x = IVar1.x - IVar2.x;
  IVar4.y = IVar1.y - IVar2.y;
  pIVar3->ActiveIdClickOffset = IVar4;
  if (((window->Flags & 4) == 0) && ((window->RootWindow->Flags & 4) == 0)) {
    pIVar3->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdNoClearOnFocusLoss = true;
    g.ActiveIdClickOffset = g.IO.MousePos - window->RootWindow->Pos;

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}